

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O3

bool_t Node_Notify(node *Node,dataid Id)

{
  nodedata *pnVar1;
  nodedata *pnVar2;
  nodedata *pnVar3;
  undefined8 *puVar4;
  nodecontext *p;
  bool bVar5;
  bool bVar6;
  nodedata **i;
  nodedata *pnVar7;
  bool_t bVar8;
  nodedata *pnVar9;
  nodedata *pnVar10;
  node *local_40;
  dataid local_38;
  
  i = Node_GetDataStart(Node,Id,0xe);
  if (i == (nodedata **)0x0) {
    bVar8 = 0;
  }
  else {
    if (Node == (node *)0x0) {
      __assert_fail("(const void*)(Node)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                    ,0x6f3,"bool_t Node_Notify(node *, dataid)");
    }
    pnVar3 = *i;
    if (pnVar3[1].Code == 0) {
      puVar4 = (undefined8 *)Node->VMT;
      p = (nodecontext *)*puVar4;
      pnVar1 = pnVar3 + 1;
      pnVar3[1].Code = (size_t)pnVar1;
      local_40 = Node;
      local_38 = Id;
      if (pnVar3[1].Next == (nodedata *)0x0) {
        __assert_fail("n!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                      ,0x6c6,"void Node_NotifyInternal(node *, dataid, nodedata **, nodecontext *)")
        ;
      }
      pnVar2 = pnVar3 + 2;
      bVar6 = false;
      bVar5 = false;
      pnVar9 = pnVar3[1].Next;
      do {
        pnVar2->Next = pnVar9;
        (*(code *)pnVar9->Code)(pnVar9[1].Next,&local_40);
        pnVar10 = pnVar9->Next;
        pnVar7 = pnVar2->Next;
        if (pnVar7 == pnVar2) {
          do {
            pnVar9 = pnVar10;
            if (pnVar9 == (nodedata *)0x0) {
              pnVar2->Next = (nodedata *)0x0;
              goto LAB_00102dc3;
            }
            pnVar2->Next = pnVar9;
            (*(code *)pnVar9->Code)(pnVar9[1].Next,&local_40);
            pnVar10 = pnVar9->Next;
            pnVar7 = pnVar2->Next;
          } while (pnVar7 == pnVar2);
          bVar5 = true;
        }
        if (pnVar7 == pnVar1) {
          bVar6 = true;
        }
        else if (pnVar7 == (nodedata *)0x0) {
          (*p->NodeHeap->Free)(p->NodeHeap,pnVar9,0x18);
          i = Node_GetDataStart(Node,Id,0xe);
        }
        pnVar9 = pnVar10;
      } while (pnVar10 != (nodedata *)0x0);
      pnVar2->Next = (nodedata *)0x0;
      if (bVar5) {
LAB_00102dc3:
        DataFree(p,Node,i,1);
        EraseNode(p,Node,(nodeclass *)(puVar4 + -9));
      }
      else if ((Id == 0xb) || (bVar6 || pnVar1->Next == (nodedata *)0x0)) {
        DataFree(p,Node,i,0);
      }
      pnVar3[1].Code = 0;
    }
    bVar8 = 1;
  }
  return bVar8;
}

Assistant:

bool_t Node_Notify(node* Node,dataid Id)
{
    nodedata** i = Node_GetDataStart(Node,Id,TYPE_NODENOTIFY);
    if (i && NodeData_Data(*i))
    {
        Node_NotifyInternal(Node,Id,i,Node_Context(Node));
        return 1;
    }
    return 0;
}